

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,String *params_9,ArrayPtr<const_char> *params_10,
          CappedArray<char,_14UL> *params_11,ArrayPtr<const_char> *params_12)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_d0;
  StringTree *local_b8;
  StringTree *local_b0;
  ArrayPtr<const_char> *local_a8;
  ArrayPtr<const_char> *local_a0;
  size_t local_98;
  char *local_90;
  long local_88;
  size_t local_80;
  size_t sStack_78;
  size_t local_70;
  size_t sStack_68;
  size_t local_60;
  size_t sStack_58;
  long local_50;
  size_t local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_98 = this->size_;
  local_90 = (params->text).content.ptr;
  local_88 = params_1->size_ - 1;
  if (params_1->size_ == 0) {
    local_88 = 0;
  }
  local_80 = (params_2->content).size_;
  sStack_78 = params_3->size_;
  local_70 = params_4->size_;
  sStack_68 = params_5->size_;
  local_60 = params_6->size_;
  sStack_58 = params_7->size_;
  local_50 = params_8->size_ - 1;
  if (params_8->size_ == 0) {
    local_50 = 0;
  }
  local_48 = (params_9->content).size_;
  pcStack_40 = params_10->ptr;
  local_38 = *(undefined8 *)params_11->content;
  nums._M_len = (size_type)params_8;
  nums._M_array = (iterator)0xd;
  local_b8 = this;
  local_a8 = params_1;
  sVar1 = _::sum((_ *)&local_98,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_98 = 0;
  local_90 = (params->text).content.ptr;
  local_88 = 0;
  local_80 = (params_2->content).size_;
  sStack_78 = params_3->size_;
  local_70 = params_4->size_;
  sStack_68 = params_5->size_;
  local_60 = params_6->size_;
  sStack_58 = params_7->size_;
  local_50 = 0;
  local_48 = (params_9->content).size_;
  pcStack_40 = params_10->ptr;
  local_38 = *(undefined8 *)params_11->content;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xd;
  local_b0 = params;
  local_a0 = (ArrayPtr<const_char> *)params_2;
  sVar1 = _::sum((_ *)&local_98,nums_00);
  heapString((String *)&local_d0,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_d0);
  Array<char>::~Array((Array<char> *)&local_d0);
  local_98 = 1;
  local_90 = (char *)0x0;
  local_88 = 1;
  local_80 = 0;
  sStack_78 = 0;
  local_70 = 0;
  sStack_68 = 0;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = 1;
  local_48 = 0;
  pcStack_40 = (char *)0x0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xd;
  sVar1 = _::sum((_ *)&local_98,nums_01);
  local_d0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_d0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_d0.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_d0);
  Array<kj::StringTree::Branch>::~Array(&local_d0);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_b8,(ArrayPtr<const_char> *)local_b0,
             (String *)local_a8,local_a0,params_3,params_4,params_5,params_6,params_7,
             (String *)params_8,(ArrayPtr<const_char> *)params_9,
             (CappedArray<char,_14UL> *)params_10,(ArrayPtr<const_char> *)params_11);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}